

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int64_t floatx80_to_int64_ppc(floatx80 a,float_status *status)

{
  _Bool _Var1;
  int iVar2;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  uint64_t local_48;
  uint64_t aSigExtra;
  uint64_t aSig;
  int local_30;
  int32_t shiftCount;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  status_local = (float_status *)a.low;
  a_local.low._0_2_ = a.high;
  a_00._10_6_ = 0;
  a_00.low = (long)a._0_10_;
  a_00.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  _Var1 = floatx80_invalid_encoding(a_00);
  if (_Var1) {
    float_raise_ppc('\x01',_aExp);
    a_local.high = 0;
    a_local._10_6_ = 0x800000000000;
  }
  else {
    a_01.high = (uint16_t)a_local.low;
    a_01.low = (uint64_t)status_local;
    a_01._10_6_ = 0;
    aSigExtra = extractFloatx80Frac(a_01);
    a_02.high = (uint16_t)a_local.low;
    a_02.low = (uint64_t)status_local;
    a_02._10_6_ = 0;
    local_30 = extractFloatx80Exp(a_02);
    a_03.high = (uint16_t)a_local.low;
    a_03.low = (uint64_t)status_local;
    a_03._10_6_ = 0;
    shiftCount._3_1_ = extractFloatx80Sign(a_03);
    aSig._4_4_ = 0x403e - local_30;
    if (aSig._4_4_ < 1) {
      if (aSig._4_4_ != 0) {
        float_raise_ppc('\x01',_aExp);
        if ((shiftCount._3_1_ != '\0') &&
           (a_04.high = (uint16_t)a_local.low, a_04.low = (uint64_t)status_local, a_04._10_6_ = 0,
           iVar2 = floatx80_is_any_nan(a_04), iVar2 == 0)) {
          return -0x8000000000000000;
        }
        return 0x7fffffffffffffff;
      }
      local_48 = 0;
    }
    else {
      shift64ExtraRightJamming(aSigExtra,0,aSig._4_4_,&aSigExtra,&local_48);
    }
    a_local._8_8_ = roundAndPackInt64(shiftCount._3_1_,aSigExtra,local_48,_aExp);
  }
  return a_local._8_8_;
}

Assistant:

int64_t floatx80_to_int64(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig, aSigExtra;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return 1ULL << 63;
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    shiftCount = 0x403E - aExp;
    if ( shiftCount <= 0 ) {
        if ( shiftCount ) {
            float_raise(float_flag_invalid, status);
            if (!aSign || floatx80_is_any_nan(a)) {
                return INT64_MAX;
            }
            return INT64_MIN;
        }
        aSigExtra = 0;
    }
    else {
        shift64ExtraRightJamming( aSig, 0, shiftCount, &aSig, &aSigExtra );
    }
    return roundAndPackInt64(aSign, aSig, aSigExtra, status);

}